

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void scm_clear(void)

{
  cell_map cStack_28;
  
  scm_stop();
  cell_map::cell_map(&cStack_28,width,height);
  cell_map::operator=(&grid,&cStack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&cStack_28.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  paint_grid();
  return;
}

Assistant:

void scm_clear()
  {
  scm_stop();
  grid = cell_map(width, height);
  paint_grid();
  }